

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_eq_quiet_riscv32(float64 a,float64 b,float_status *status)

{
  uint uVar1;
  uint64_t a_1;
  float64 fVar2;
  float64 fVar3;
  
  fVar2 = float64_squash_input_denormal_riscv32(a,status);
  fVar3 = float64_squash_input_denormal_riscv32(b,status);
  if (((~fVar2 & 0x7ff0000000000000) == 0 && (fVar2 & 0xfffffffffffff) != 0) ||
     ((fVar3 & 0xfffffffffffff) != 0 && (~fVar3 & 0x7ff0000000000000) == 0)) {
    if (((fVar2 & 0x7ff8000000000000) == 0x7ff0000000000000 && (fVar2 & 0x7ffffffffffff) != 0) ||
       (uVar1 = 0,
       (fVar3 & 0x7ffffffffffff) != 0 && (fVar3 & 0x7ff8000000000000) == 0x7ff0000000000000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar1 = 0;
    }
  }
  else {
    uVar1 = (uint)(((fVar3 | fVar2) & 0x7fffffffffffffff) == 0 || fVar2 == fVar3);
  }
  return uVar1;
}

Assistant:

int float64_eq_quiet(float64 a, float64 b, float_status *status)
{
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    av = float64_val(a);
    bv = float64_val(b);
    return ( av == bv ) || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );

}